

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Matrix<float,_2,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Inverse<2>::doExpand
          (Inverse<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  undefined8 *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Matrix<float,_2,_2>_> EVar1;
  ExprP<tcu::Matrix<float,_2,_2>_> mat;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_140;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> local_130;
  ExprP<float> det;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_> local_110;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_100;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_f0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_e0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_d0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_c0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_b0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_a0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_90;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_80;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_70;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_60;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_50;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_40;
  string local_30;
  
  mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.super_ExprPBase<tcu::Matrix<float,_2,_2>_>
  .super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_2,_2>_> *)*in_RCX;
  mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.super_ExprPBase<tcu::Matrix<float,_2,_2>_>
  .super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state
       = (SharedPtrStateBase *)in_RCX[1];
  if (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
    m_state)->strongRefCount =
         (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
         m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
    m_state)->weakRefCount =
         (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
         m_state)->weakRefCount + 1;
    UNLOCK();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"det",(allocator<char> *)&local_100);
  local_110.m_ptr =
       mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
       super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
       m_ptr;
  local_110.m_state =
       mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
       super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
       m_state;
  if (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
    m_state)->strongRefCount =
         (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
         m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
    m_state)->weakRefCount =
         (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
         m_state)->weakRefCount + 1;
    UNLOCK();
  }
  determinant<2>((Functions *)&local_140,(ExprP<tcu::Matrix<float,_2,_2>_> *)&local_110);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_130,&local_30,(ExpandContext *)args,
             (ExprP<float> *)&local_140);
  VariableP::operator_cast_to_ExprP((VariableP *)&det);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::release(&local_130);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_140);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>::release
            (&local_110);
  std::__cxx11::string::~string((string *)&local_30);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_100,(int)&mat);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_140,(int)&local_100);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_130,(ExprP<float> *)&local_140,&det);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_70,(int)&mat);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_60,(int)&local_70);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_50,(ExprP<float> *)&local_60);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_40,(ExprP<float> *)&local_50,&det);
  vec2((Functions *)&local_30,(ExprP<float> *)&local_130,(ExprP<float> *)&local_40);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_c0,(int)&mat);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_b0,(int)&local_c0);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_a0,(ExprP<float> *)&local_b0);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_90,(ExprP<float> *)&local_a0,&det);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_f0,(int)&mat);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_e0,(int)&local_f0);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_d0,(ExprP<float> *)&local_e0,&det);
  vec2((Functions *)&local_80,(ExprP<float> *)&local_90,(ExprP<float> *)&local_d0);
  mat2<float,2>((Functions *)this,(ExprP<tcu::Vector<float,_2>_> *)&local_30,
                (ExprP<tcu::Vector<float,_2>_> *)&local_80);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_80);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_e0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_90);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_a0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_b0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> *)
             &local_30);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_40);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_50);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_60);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_70);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&local_130);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_140);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_100);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)&det);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_> *)
             &mat);
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state
       = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_2,_2>_> *)this;
  return (ExprP<tcu::Matrix<float,_2,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand (ExpandContext& ctx, const ArgExprs& args) const
	{
		ExprP<Mat2>		mat = args.a;
		ExprP<float>	det	= bindExpression("det", ctx, determinant(mat));

		return mat2(vec2(mat[1][1] / det, -mat[0][1] / det),
					vec2(-mat[1][0] / det, mat[0][0] / det));
	}